

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_init(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_timer_t *puVar4;
  uv_loop_t *unaff_RBX;
  uv_timer_t handle;
  uv_timer_t uStack_2c0;
  uv_loop_t *puStack_228;
  code *pcStack_220;
  uv_loop_t *puStack_218;
  code *pcStack_210;
  uv_loop_t *puStack_208;
  code *pcStack_200;
  code *pcStack_1f8;
  undefined1 auStack_1f0 [8];
  undefined1 auStack_1e8 [152];
  undefined1 auStack_150 [160];
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat((uv_timer_t *)&stack0xffffffffffffff60);
    if (uVar3 != 0) goto LAB_00174bf1;
    iVar1 = uv_is_active((uv_handle_t *)&stack0xffffffffffffff60);
    if (iVar1 != 0) goto LAB_00174bf6;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_00174bf1:
    run_test_timer_init_cold_2();
LAB_00174bf6:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  auStack_1f0._4_4_ = 0;
  auStack_1f0._0_4_ = 1;
  pcStack_1f8 = (code *)0x174c1e;
  auStack_150._152_8_ = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_1f8 = (code *)0x174c2e;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_150);
  if (iVar1 == 0) {
    pcStack_1f8 = (code *)0x174c3b;
    puVar2 = uv_default_loop();
    pcStack_1f8 = (code *)0x174c48;
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_1e8);
    if (iVar1 != 0) goto LAB_00174d95;
    unaff_RBX = (uv_loop_t *)(auStack_1f0 + 4);
    puVar2 = (uv_loop_t *)auStack_150;
    pcStack_1f8 = (code *)0x174c70;
    auStack_150._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_00174d9a;
    puVar2 = (uv_loop_t *)auStack_1e8;
    pcStack_1f8 = (code *)0x174c93;
    auStack_1e8._0_8_ = (uv_loop_t *)auStack_1f0;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00174d9f;
    pcStack_1f8 = (code *)0x174ca0;
    puVar2 = uv_default_loop();
    pcStack_1f8 = (code *)0x174caa;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00174da4;
    if (order_cb_called != 2) goto LAB_00174da9;
    puVar2 = (uv_loop_t *)auStack_150;
    pcStack_1f8 = (code *)0x174ccc;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_00174dae;
    puVar2 = (uv_loop_t *)auStack_1e8;
    pcStack_1f8 = (code *)0x174cde;
    iVar1 = uv_timer_stop((uv_timer_t *)puVar2);
    if (iVar1 != 0) goto LAB_00174db3;
    order_cb_called = 0;
    puVar2 = (uv_loop_t *)auStack_1e8;
    pcStack_1f8 = (code *)0x174d08;
    auStack_1e8._0_8_ = unaff_RBX;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00174db8;
    puVar2 = (uv_loop_t *)auStack_150;
    pcStack_1f8 = (code *)0x174d2b;
    auStack_150._0_8_ = (uv_loop_t *)auStack_1f0;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_00174dbd;
    pcStack_1f8 = (code *)0x174d38;
    puVar2 = uv_default_loop();
    pcStack_1f8 = (code *)0x174d42;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00174dc2;
    if (order_cb_called != 2) goto LAB_00174dc7;
    pcStack_1f8 = (code *)0x174d54;
    unaff_RBX = uv_default_loop();
    pcStack_1f8 = (code *)0x174d68;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_1f8 = (code *)0x174d72;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_1f8 = (code *)0x174d77;
    puVar2 = uv_default_loop();
    pcStack_1f8 = (code *)0x174d7f;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1f8 = (code *)0x174d95;
    run_test_timer_order_cold_1();
LAB_00174d95:
    pcStack_1f8 = (code *)0x174d9a;
    run_test_timer_order_cold_2();
LAB_00174d9a:
    pcStack_1f8 = (code *)0x174d9f;
    run_test_timer_order_cold_3();
LAB_00174d9f:
    pcStack_1f8 = (code *)0x174da4;
    run_test_timer_order_cold_4();
LAB_00174da4:
    pcStack_1f8 = (code *)0x174da9;
    run_test_timer_order_cold_5();
LAB_00174da9:
    pcStack_1f8 = (code *)0x174dae;
    run_test_timer_order_cold_6();
LAB_00174dae:
    pcStack_1f8 = (code *)0x174db3;
    run_test_timer_order_cold_7();
LAB_00174db3:
    pcStack_1f8 = (code *)0x174db8;
    run_test_timer_order_cold_8();
LAB_00174db8:
    pcStack_1f8 = (code *)0x174dbd;
    run_test_timer_order_cold_9();
LAB_00174dbd:
    pcStack_1f8 = (code *)0x174dc2;
    run_test_timer_order_cold_10();
LAB_00174dc2:
    pcStack_1f8 = (code *)0x174dc7;
    run_test_timer_order_cold_11();
LAB_00174dc7:
    pcStack_1f8 = (code *)0x174dcc;
    run_test_timer_order_cold_12();
  }
  pcStack_1f8 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_1f8 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  pcStack_200 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_200 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == *puVar2->data) {
    return iVar1;
  }
  puStack_208 = (uv_loop_t *)run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_210 = (code *)0x174e11;
  puStack_208 = unaff_RBX;
  puVar4 = (uv_timer_t *)uv_default_loop();
  pcStack_210 = (code *)0x174e20;
  iVar1 = uv_timer_init((uv_loop_t *)puVar4,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_210 = (code *)0x174e2d;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x174e3c;
    iVar1 = uv_timer_init((uv_loop_t *)puVar4,&huge_timer1);
    if (iVar1 != 0) goto LAB_00174f15;
    pcStack_210 = (code *)0x174e49;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x174e58;
    iVar1 = uv_timer_init((uv_loop_t *)puVar4,&huge_timer2);
    if (iVar1 != 0) goto LAB_00174f1a;
    puVar4 = &tiny_timer;
    pcStack_210 = (code *)0x174e7a;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00174f1f;
    puVar4 = &huge_timer1;
    pcStack_210 = (code *)0x174ea1;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00174f24;
    puVar4 = &huge_timer2;
    pcStack_210 = (code *)0x174ec1;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00174f29;
    pcStack_210 = (code *)0x174eca;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x174ed4;
    iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00174f2e;
    pcStack_210 = (code *)0x174edd;
    unaff_RBX = uv_default_loop();
    pcStack_210 = (code *)0x174ef1;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_210 = (code *)0x174efb;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_210 = (code *)0x174f00;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_210 = (code *)0x174f08;
    iVar1 = uv_loop_close((uv_loop_t *)puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_210 = (code *)0x174f15;
    run_test_timer_huge_timeout_cold_1();
LAB_00174f15:
    pcStack_210 = (code *)0x174f1a;
    run_test_timer_huge_timeout_cold_2();
LAB_00174f1a:
    pcStack_210 = (code *)0x174f1f;
    run_test_timer_huge_timeout_cold_3();
LAB_00174f1f:
    pcStack_210 = (code *)0x174f24;
    run_test_timer_huge_timeout_cold_4();
LAB_00174f24:
    pcStack_210 = (code *)0x174f29;
    run_test_timer_huge_timeout_cold_5();
LAB_00174f29:
    pcStack_210 = (code *)0x174f2e;
    run_test_timer_huge_timeout_cold_6();
LAB_00174f2e:
    pcStack_210 = (code *)0x174f33;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_210 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar4 == &tiny_timer) {
    puStack_218 = (uv_loop_t *)0x174f53;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    puStack_218 = (uv_loop_t *)0x174f61;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  puStack_218 = (uv_loop_t *)run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_220 = (code *)0x174f7b;
  puStack_218 = unaff_RBX;
  puVar4 = (uv_timer_t *)uv_default_loop();
  pcStack_220 = (code *)0x174f8a;
  iVar1 = uv_timer_init((uv_loop_t *)puVar4,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_220 = (code *)0x174f97;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x174fa6;
    iVar1 = uv_timer_init((uv_loop_t *)puVar4,&huge_timer1);
    if (iVar1 != 0) goto LAB_00175042;
    puVar4 = &tiny_timer;
    pcStack_220 = (code *)0x174fcb;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00175047;
    puVar4 = &huge_timer1;
    pcStack_220 = (code *)0x174fee;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_0017504c;
    pcStack_220 = (code *)0x174ff7;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x175001;
    iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00175051;
    pcStack_220 = (code *)0x17500a;
    unaff_RBX = uv_default_loop();
    pcStack_220 = (code *)0x17501e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_220 = (code *)0x175028;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_220 = (code *)0x17502d;
    puVar4 = (uv_timer_t *)uv_default_loop();
    pcStack_220 = (code *)0x175035;
    iVar1 = uv_loop_close((uv_loop_t *)puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_220 = (code *)0x175042;
    run_test_timer_huge_repeat_cold_1();
LAB_00175042:
    pcStack_220 = (code *)0x175047;
    run_test_timer_huge_repeat_cold_2();
LAB_00175047:
    pcStack_220 = (code *)0x17504c;
    run_test_timer_huge_repeat_cold_3();
LAB_0017504c:
    pcStack_220 = (code *)0x175051;
    run_test_timer_huge_repeat_cold_4();
LAB_00175051:
    pcStack_220 = (code *)0x175056;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_220 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar4 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX_00;
    }
  }
  else {
    if (puVar4 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX_00;
      }
      puStack_228 = (uv_loop_t *)0x17508d;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_01;
    }
    puStack_228 = (uv_loop_t *)0x1750b9;
    huge_repeat_cb_cold_1();
  }
  puStack_228 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_228 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_2c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_2c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001751cd;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001751d7;
    iVar1 = uv_timer_start(&uStack_2c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001751dc;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751e1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001751e6;
    uv_close((uv_handle_t *)&uStack_2c0,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001751f0;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001751cd:
    run_test_timer_run_once_cold_2();
LAB_001751d2:
    run_test_timer_run_once_cold_3();
LAB_001751d7:
    run_test_timer_run_once_cold_4();
LAB_001751dc:
    run_test_timer_run_once_cold_5();
LAB_001751e1:
    run_test_timer_run_once_cold_6();
LAB_001751e6:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001751f0:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}